

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

RTMatrix4x4 * __thiscall RTMatrix4x4::operator=(RTMatrix4x4 *this,RTMatrix4x4 *mat)

{
  RTMatrix4x4 *pRVar1;
  int row;
  long lVar2;
  long lVar3;
  
  pRVar1 = this;
  if (this != mat) {
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        (*(RTFLOAT (*) [4])*(RTFLOAT (*) [4])this)[lVar3] =
             (*(RTFLOAT (*) [4])*(RTFLOAT (*) [4])mat)[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      lVar2 = lVar2 + 1;
      mat = (RTMatrix4x4 *)((long)mat + 0x10);
      this = (RTMatrix4x4 *)((long)this + 0x10);
    } while (lVar2 != 4);
  }
  return pRVar1;
}

Assistant:

RTMatrix4x4& RTMatrix4x4::operator =(const RTMatrix4x4& mat)
{
    if (this == &mat)
        return *this;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            m_data[row][col] = mat.m_data[row][col];

    return *this;
}